

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int lws_tls_extant(char *name)

{
  ssize_t sVar1;
  undefined1 local_21;
  int local_20;
  int iStack_1c;
  char buf [1];
  int n;
  int fd;
  char *name_local;
  
  iStack_1c = open(name,0);
  if (iStack_1c < 0) {
    name_local._4_4_ = 1;
  }
  else {
    sVar1 = read(iStack_1c,&local_21,1);
    local_20 = (int)sVar1;
    close(iStack_1c);
    name_local._4_4_ = (uint)(local_20 != 1);
  }
  return name_local._4_4_;
}

Assistant:

static int
lws_tls_extant(const char *name)
{
	/* it exists if we can open it... */
	int fd = open(name, O_RDONLY), n;
	char buf[1];

	if (fd < 0)
		return 1;

	/* and we can read at least one byte out of it */
	n = read(fd, buf, 1);
	close(fd);

	return n != 1;
}